

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall Memory::Recycler::PrintAllocStats(Recycler *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  TrackerItem *pTVar4;
  type_info *this_00;
  size_t sVar5;
  size_t sVar6;
  int64 iVar7;
  int64 iVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  TrackerItem **ppTVar12;
  type_info **pptVar13;
  char *pcVar14;
  undefined8 in_stack_fffffffffffffee8;
  undefined4 uVar15;
  int64 in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  undefined4 uVar16;
  type_info *typeinfo;
  TrackerItem *item;
  long lStack_50;
  int i;
  int64 freeSize;
  long lStack_40;
  int freeCount;
  int64 allocSize;
  int64 reqSize;
  long lStack_28;
  int allocCount;
  size_t itemCount;
  Recycler *this_local;
  
  if (this->trackerDictionary != (TypeInfotoTrackerItemMap *)0x0) {
    lStack_28 = 0;
    reqSize._4_4_ = 0;
    allocSize = 0;
    lStack_40 = 0;
    freeSize._4_4_ = 0;
    lStack_50 = 0;
    Output::Print(
                 L"=================================================================================================================\n"
                 );
    Output::Print(L"Recycler Allocations\n");
    Output::Print(
                 L"=================================================================================================================\n"
                 );
    Output::Print(
                 L"ItemSize  ItemCount   AllocCount  RequestSize      AllocSize        FreeCount   FreeSize         DiffCount   DiffSize        \n"
                 );
    Output::Print(
                 L"--------  ----------  ----------  ---------------  ---------------  ----------  ---------------  ----------  ---------------\n"
                 );
    item._4_4_ = 0;
    while( true ) {
      iVar11 = JsUtil::
               BaseDictionary<const_std::type_info_*,_Memory::Recycler::TrackerItem_*,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::Count(this->trackerDictionary);
      uVar15 = (undefined4)((ulong)in_stack_fffffffffffffef0 >> 0x20);
      if (iVar11 <= item._4_4_) break;
      ppTVar12 = JsUtil::
                 BaseDictionary<const_std::type_info_*,_Memory::Recycler::TrackerItem_*,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ::GetValueAt(this->trackerDictionary,item._4_4_);
      pTVar4 = *ppTVar12;
      pptVar13 = JsUtil::
                 BaseDictionary<const_std::type_info_*,_Memory::Recycler::TrackerItem_*,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ::GetKeyAt(this->trackerDictionary,item._4_4_);
      uVar16 = (undefined4)((ulong)in_stack_fffffffffffffef8 >> 0x20);
      uVar15 = (undefined4)((ulong)in_stack_fffffffffffffee8 >> 0x20);
      this_00 = *pptVar13;
      if ((pTVar4->instanceData).AllocCount != 0) {
        sVar5 = (pTVar4->instanceData).ItemSize;
        sVar6 = (pTVar4->instanceData).ItemCount;
        uVar1 = (pTVar4->instanceData).AllocCount;
        iVar7 = (pTVar4->instanceData).ReqSize;
        iVar8 = (pTVar4->instanceData).AllocSize;
        iVar11 = (pTVar4->instanceData).FreeCount;
        in_stack_fffffffffffffef0 = (pTVar4->instanceData).FreeSize;
        iVar2 = (pTVar4->instanceData).AllocCount;
        iVar3 = (pTVar4->instanceData).FreeCount;
        lVar9 = (pTVar4->instanceData).AllocSize;
        lVar10 = (pTVar4->instanceData).FreeSize;
        pcVar14 = std::type_info::name(this_00);
        in_stack_fffffffffffffee8 = CONCAT44(uVar15,iVar11);
        in_stack_fffffffffffffef8 = CONCAT44(uVar16,iVar2 - iVar3);
        Output::Print(L"%8d  %10d  %10d  %15I64d  %15I64d  %10d  %15I64d  %10d  %15I64d  %S\n",sVar5
                      ,sVar6,(ulong)uVar1,iVar7,iVar8,in_stack_fffffffffffffee8,
                      in_stack_fffffffffffffef0,in_stack_fffffffffffffef8,lVar9 - lVar10,pcVar14);
        lStack_28 = (pTVar4->instanceData).ItemCount + lStack_28;
        reqSize._4_4_ = (pTVar4->instanceData).AllocCount + reqSize._4_4_;
        allocSize = (pTVar4->instanceData).ReqSize + allocSize;
        lStack_40 = (pTVar4->instanceData).AllocSize + lStack_40;
        freeSize._4_4_ = (pTVar4->instanceData).FreeCount + freeSize._4_4_;
        lStack_50 = (pTVar4->instanceData).FreeSize + lStack_50;
      }
      uVar16 = (undefined4)((ulong)in_stack_fffffffffffffef8 >> 0x20);
      uVar15 = (undefined4)((ulong)in_stack_fffffffffffffee8 >> 0x20);
      if ((pTVar4->arrayData).AllocCount != 0) {
        sVar5 = (pTVar4->arrayData).ItemSize;
        sVar6 = (pTVar4->arrayData).ItemCount;
        uVar1 = (pTVar4->arrayData).AllocCount;
        iVar7 = (pTVar4->arrayData).ReqSize;
        iVar8 = (pTVar4->arrayData).AllocSize;
        iVar11 = (pTVar4->arrayData).FreeCount;
        in_stack_fffffffffffffef0 = (pTVar4->arrayData).FreeSize;
        iVar2 = (pTVar4->instanceData).AllocCount;
        iVar3 = (pTVar4->instanceData).FreeCount;
        lVar9 = (pTVar4->arrayData).AllocSize;
        lVar10 = (pTVar4->arrayData).FreeSize;
        pcVar14 = std::type_info::name(this_00);
        in_stack_fffffffffffffee8 = CONCAT44(uVar15,iVar11);
        in_stack_fffffffffffffef8 = CONCAT44(uVar16,iVar2 - iVar3);
        Output::Print(L"%8d  %10d  %10d  %15I64d  %15I64d  %10d  %15I64d  %10d  %15I64d  %S[]\n",
                      sVar5,sVar6,(ulong)uVar1,iVar7,iVar8,in_stack_fffffffffffffee8,
                      in_stack_fffffffffffffef0,in_stack_fffffffffffffef8,lVar9 - lVar10,pcVar14);
        lStack_28 = (pTVar4->arrayData).ItemCount + lStack_28;
        reqSize._4_4_ = (pTVar4->arrayData).AllocCount + reqSize._4_4_;
        allocSize = (pTVar4->arrayData).ReqSize + allocSize;
        lStack_40 = (pTVar4->arrayData).AllocSize + lStack_40;
        freeSize._4_4_ = (pTVar4->arrayData).FreeCount + freeSize._4_4_;
        lStack_50 = (pTVar4->arrayData).FreeSize + lStack_50;
      }
      item._4_4_ = item._4_4_ + 1;
    }
    Output::Print(
                 L"--------  ----------  ----------  ---------------  ---------------  ----------  ---------------  ----------  ---------------\n"
                 );
    Output::Print(L"            %8d  %10d  %15I64d  %15I64d  %10d  %15I64d  %10d  %15I64d  **Total**\n"
                  ,lStack_28,(ulong)reqSize._4_4_,allocSize,lStack_40,(ulong)freeSize._4_4_,
                  lStack_50,CONCAT44(uVar15,reqSize._4_4_ - freeSize._4_4_),lStack_40 - lStack_50);
    Output::Flush();
  }
  return;
}

Assistant:

void
Recycler::PrintAllocStats()
{
    if (this->trackerDictionary == nullptr)
    {
        return;
    }
    size_t itemCount = 0;
    int allocCount = 0;
    int64 reqSize = 0;
    int64 allocSize = 0;
    int freeCount = 0;
    int64 freeSize = 0;
    Output::Print(_u("=================================================================================================================\n"));
    Output::Print(_u("Recycler Allocations\n"));
    Output::Print(_u("=================================================================================================================\n"));
    Output::Print(_u("ItemSize  ItemCount   AllocCount  RequestSize      AllocSize        FreeCount   FreeSize         DiffCount   DiffSize        \n"));
    Output::Print(_u("--------  ----------  ----------  ---------------  ---------------  ----------  ---------------  ----------  ---------------\n"));
    for (int i = 0; i < trackerDictionary->Count(); i++)
    {
        TrackerItem * item = trackerDictionary->GetValueAt(i);
        type_info const * typeinfo = trackerDictionary->GetKeyAt(i);
        if (item->instanceData.AllocCount != 0)
        {
            Output::Print(_u("%8d  %10d  %10d  %15I64d  %15I64d  %10d  %15I64d  %10d  %15I64d  %S\n"),
                item->instanceData.ItemSize, item->instanceData.ItemCount, item->instanceData.AllocCount, item->instanceData.ReqSize,
                item->instanceData.AllocSize, item->instanceData.FreeCount, item->instanceData.FreeSize,
                item->instanceData.AllocCount - item->instanceData.FreeCount,  item->instanceData.AllocSize - item->instanceData.FreeSize, typeinfo->name());
            itemCount += item->instanceData.ItemCount;
            allocCount += item->instanceData.AllocCount;
            reqSize += item->instanceData.ReqSize;
            allocSize += item->instanceData.AllocSize;
            freeCount += item->instanceData.FreeCount;
            freeSize += item->instanceData.FreeSize;
        }

        if (item->arrayData.AllocCount != 0)
        {
            Output::Print(_u("%8d  %10d  %10d  %15I64d  %15I64d  %10d  %15I64d  %10d  %15I64d  %S[]\n"),
                item->arrayData.ItemSize, item->arrayData.ItemCount, item->arrayData.AllocCount, item->arrayData.ReqSize,
                item->arrayData.AllocSize, item->arrayData.FreeCount, item->arrayData.FreeSize,
                item->instanceData.AllocCount - item->instanceData.FreeCount, item->arrayData.AllocSize - item->arrayData.FreeSize, typeinfo->name());
            itemCount += item->arrayData.ItemCount;
            allocCount += item->arrayData.AllocCount;
            reqSize += item->arrayData.ReqSize;
            allocSize += item->arrayData.AllocSize;
            freeCount += item->arrayData.FreeCount;
            freeSize += item->arrayData.FreeSize;
        }
    }
    Output::Print(_u("--------  ----------  ----------  ---------------  ---------------  ----------  ---------------  ----------  ---------------\n"));
    Output::Print(_u("            %8d  %10d  %15I64d  %15I64d  %10d  %15I64d  %10d  %15I64d  **Total**\n"),
        itemCount, allocCount, reqSize, allocSize, freeCount, freeSize, allocCount - freeCount, allocSize - freeSize);

#ifdef EXCEL_FRIENDLY_DUMP
    Output::Print(_u("\nExcel friendly version\nItemSize\tItemCount\tAllocCount\tRequestSize\tAllocSize\tFreeCount\tFreeSize\tDiffCount\tDiffSize\tType\n"));
    for (int i = 0; i < trackerDictionary->Count(); i++)
    {
        TrackerItem * item = trackerDictionary->GetValueAt(i);
        type_info const * typeinfo = trackerDictionary->GetKeyAt(i);
        if (item->instanceData.AllocCount != 0)
        {
            Output::Print(_u("%d\t%d\t%d\t%I64d\t%I64d\t%d\t%I64d\t%d\t%I64d\t%S\n"),
                item->instanceData.ItemSize, item->instanceData.ItemCount, item->instanceData.AllocCount, item->instanceData.ReqSize,
                item->instanceData.AllocSize, item->instanceData.FreeCount, item->instanceData.FreeSize,
                item->instanceData.AllocCount - item->instanceData.FreeCount,  item->instanceData.AllocSize - item->instanceData.FreeSize, typeinfo->name());
        }
        if (item->arrayData.AllocCount != 0)
        {
            Output::Print(_u("%d\t%d\t%d\t%I64d\t%I64d\t%d\t%I64d\t%d\t%I64d\t%S[]\n"),
                item->arrayData.ItemSize, item->arrayData.ItemCount, item->arrayData.AllocCount, item->arrayData.ReqSize,
                item->arrayData.AllocSize, item->arrayData.FreeCount, item->arrayData.FreeSize,
                item->instanceData.AllocCount - item->instanceData.FreeCount, item->arrayData.AllocSize - item->arrayData.FreeSize, typeinfo->name());
        }
    }
#endif // EXCEL_FRIENDLY_DUMP
    Output::Flush();
}